

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

char * __thiscall
spirv_cross::CompilerGLSL::to_storage_qualifiers_glsl(CompilerGLSL *this,SPIRVariable *var)

{
  StorageClass SVar1;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  uint32_t location;
  SPIREntryPoint *pSVar5;
  char *pcVar6;
  char *pcVar7;
  ExecutionModel EVar8;
  
  pSVar5 = Compiler::get_entry_point(&this->super_Compiler);
  bVar3 = subpass_input_is_framebuffer_fetch(this,(var->super_IVariant).self.id);
  pcVar6 = "";
  if (bVar3) {
    return pcVar6;
  }
  SVar1 = var->storage;
  if (0x14cf < (int)SVar1) {
    if ((int)SVar1 < 0x14da) {
      if (SVar1 == StorageClassCallableDataKHR) {
        pcVar7 = "callableDataEXT ";
        pcVar6 = "callableDataNV ";
      }
      else {
        if (SVar1 != StorageClassIncomingCallableDataKHR) {
          return pcVar6;
        }
        pcVar7 = "callableDataInEXT ";
        pcVar6 = "callableDataInNV ";
      }
    }
    else if (SVar1 == StorageClassRayPayloadKHR) {
      pcVar7 = "rayPayloadEXT ";
      pcVar6 = "rayPayloadNV ";
    }
    else if (SVar1 == StorageClassHitAttributeKHR) {
      pcVar7 = "hitAttributeEXT ";
      pcVar6 = "hitAttributeNV ";
    }
    else {
      if (SVar1 != StorageClassIncomingRayPayloadKHR) {
        return pcVar6;
      }
      pcVar7 = "rayPayloadInEXT ";
      pcVar6 = "rayPayloadInNV ";
    }
    if (this->ray_tracing_is_khr == false) {
      return pcVar6;
    }
    return pcVar7;
  }
  if (StorageClassPushConstant < SVar1) {
    return pcVar6;
  }
  if ((0x205U >> (SVar1 & 0x1f) & 1) != 0) {
    return "uniform ";
  }
  if ((10U >> (SVar1 & 0x1f) & 1) == 0) {
    return pcVar6;
  }
  bVar3 = (this->options).es;
  uVar2 = (this->options).version;
  if ((uVar2 < 300 & bVar3) == 1) {
    EVar8 = pSVar5->model;
    bVar4 = 1;
    if (EVar8 == ExecutionModelVertex) {
LAB_001e35eb:
      pcVar7 = "attribute ";
      pcVar6 = "varying ";
      goto LAB_001e364e;
    }
  }
  else {
    bVar4 = ~bVar3 & uVar2 < 0x82;
    EVar8 = pSVar5->model;
    if ((EVar8 == ExecutionModelVertex & bVar4) == 1) goto LAB_001e35eb;
  }
  if ((bVar4 & EVar8 == ExecutionModelFragment) != 0) {
    return "varying ";
  }
  if (SVar1 == StorageClassOutput && EVar8 == ExecutionModelFragment) {
    location = Compiler::get_decoration
                         (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationLocation
                         );
    bVar3 = location_is_framebuffer_fetch(this,location);
    if (!bVar3) {
      return "out ";
    }
    return "inout ";
  }
  pcVar7 = "in ";
  pcVar6 = "out ";
LAB_001e364e:
  if (SVar1 == StorageClassInput) {
    pcVar6 = pcVar7;
  }
  return pcVar6;
}

Assistant:

const char *CompilerGLSL::to_storage_qualifiers_glsl(const SPIRVariable &var)
{
	auto &execution = get_entry_point();

	if (subpass_input_is_framebuffer_fetch(var.self))
		return "";

	if (var.storage == StorageClassInput || var.storage == StorageClassOutput)
	{
		if (is_legacy() && execution.model == ExecutionModelVertex)
			return var.storage == StorageClassInput ? "attribute " : "varying ";
		else if (is_legacy() && execution.model == ExecutionModelFragment)
			return "varying "; // Fragment outputs are renamed so they never hit this case.
		else if (execution.model == ExecutionModelFragment && var.storage == StorageClassOutput)
		{
			uint32_t loc = get_decoration(var.self, DecorationLocation);
			bool is_inout = location_is_framebuffer_fetch(loc);
			if (is_inout)
				return "inout ";
			else
				return "out ";
		}
		else
			return var.storage == StorageClassInput ? "in " : "out ";
	}
	else if (var.storage == StorageClassUniformConstant || var.storage == StorageClassUniform ||
	         var.storage == StorageClassPushConstant)
	{
		return "uniform ";
	}
	else if (var.storage == StorageClassRayPayloadKHR)
	{
		return ray_tracing_is_khr ? "rayPayloadEXT " : "rayPayloadNV ";
	}
	else if (var.storage == StorageClassIncomingRayPayloadKHR)
	{
		return ray_tracing_is_khr ? "rayPayloadInEXT " : "rayPayloadInNV ";
	}
	else if (var.storage == StorageClassHitAttributeKHR)
	{
		return ray_tracing_is_khr ? "hitAttributeEXT " : "hitAttributeNV ";
	}
	else if (var.storage == StorageClassCallableDataKHR)
	{
		return ray_tracing_is_khr ? "callableDataEXT " : "callableDataNV ";
	}
	else if (var.storage == StorageClassIncomingCallableDataKHR)
	{
		return ray_tracing_is_khr ? "callableDataInEXT " : "callableDataInNV ";
	}

	return "";
}